

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ParseFrameworkMappings(ImportWriter *this)

{
  bool bVar1;
  ostream *poVar2;
  string parse_error;
  ProtoFrameworkCollector collector;
  string local_38;
  LineConsumer local_18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_10;
  
  this->need_to_parse_mapping_file_ = false;
  if ((this->named_framework_to_proto_path_mappings_path_)._M_string_length != 0) {
    local_10 = &this->proto_file_to_framework_name_;
    local_18._vptr_LineConsumer = (_func_int **)&PTR__LineConsumer_004d8178;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    bVar1 = ParseSimpleFile(&this->named_framework_to_proto_path_mappings_path_,&local_18,&local_38)
    ;
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"error parsing ");
      poVar2 = std::operator<<(poVar2,(string *)&this->named_framework_to_proto_path_mappings_path_)
      ;
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = std::operator<<(poVar2,(string *)&local_38);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::ostream::flush();
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void ImportWriter::ParseFrameworkMappings() {
  need_to_parse_mapping_file_ = false;
  if (named_framework_to_proto_path_mappings_path_.empty()) {
    return;  // Nothing to do.
  }

  ProtoFrameworkCollector collector(&proto_file_to_framework_name_);
  std::string parse_error;
  if (!ParseSimpleFile(named_framework_to_proto_path_mappings_path_,
                       &collector, &parse_error)) {
    std::cerr << "error parsing " << named_framework_to_proto_path_mappings_path_
         << " : " << parse_error << std::endl;
    std::cerr.flush();
  }
}